

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = fFirst == 0;
  do {
    if (((((ulong)pObj & 1) != 0) || (uVar2 = *(ulong *)pObj, (~(uint)uVar2 & 0x9fffffff) == 0)) ||
       ((bVar3 && (1 < (int)pObj->Value)))) goto LAB_004d948a;
    if (fUseMuxes != 0) {
      iVar1 = Gia_ObjIsMuxType(pObj);
      if (iVar1 != 0) {
LAB_004d948a:
        Vec_PtrPushUnique(vSuper,pObj);
        return;
      }
      uVar2 = *(ulong *)pObj;
    }
    Cec_CollectSuper_rec
              ((Gia_Obj_t *)
               ((ulong)((uint)(uVar2 >> 0x1d) & 1) | (ulong)(pObj + -(uVar2 & 0x1fffffff))),vSuper,0
               ,fUseMuxes);
    pObj = (Gia_Obj_t *)
           ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) |
           (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)));
    bVar3 = true;
  } while( true );
}

Assistant:

void Cec_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && Gia_ObjIsMuxType(pObj)) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}